

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void __thiscall mjs::value::destroy(value *this)

{
  value_type vVar1;
  wostream *pwVar2;
  char *pcVar3;
  wostringstream _woss;
  wstring_view local_198;
  wostringstream local_188 [376];
  
  vVar1 = this->type_;
  if (number < vVar1) {
    if (1 < vVar1 - string) {
      if (vVar1 != reference) {
        std::__cxx11::wostringstream::wostringstream(local_188);
        pwVar2 = std::operator<<((wostream *)local_188,"Not implemented: ");
        pcVar3 = string_value(this->type_);
        std::operator<<(pwVar2,pcVar3);
        std::__cxx11::wstringbuf::str();
        throw_runtime_error(&local_198,
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                            ,0x52);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped
                ((gc_heap_ptr_untyped *)&(this->field_1).r_.property_name_);
    }
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&(this->field_1).s_);
  }
  this->type_ = undefined;
  return;
}

Assistant:

void value::destroy() {
    switch (type_) {
    case value_type::undefined: break;
    case value_type::null: break;
    case value_type::boolean: break;
    case value_type::number: break;
    case value_type::string: s_.~string(); break;
    case value_type::object: o_.~gc_heap_ptr(); break;
    case value_type::reference: r_.~reference(); break;
    default: NOT_IMPLEMENTED(type_);
    }
    type_ = value_type::undefined;
}